

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

VW_HANDLE VW_InitializeA(char *pstrArgs)

{
  vw *pvVar1;
  char *in_RDI;
  vw *all;
  string s;
  string local_68 [32];
  vw *local_48;
  void *in_stack_ffffffffffffffd0;
  trace_message_t in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe7;
  io_buf *in_stack_ffffffffffffffe8;
  string *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd8,in_RDI,(allocator *)&stack0xffffffffffffffd7);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  std::__cxx11::string::string(local_68,(string *)&stack0xffffffffffffffd8);
  pvVar1 = VW::initialize(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,
                          (bool)in_stack_ffffffffffffffe7,in_stack_ffffffffffffffd8,
                          in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_68);
  local_48 = pvVar1;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  return pvVar1;
}

Assistant:

VW_DLL_MEMBER VW_HANDLE VW_CALLING_CONV VW_InitializeA(const char * pstrArgs)
{ string s(pstrArgs);
  vw* all = VW::initialize(s);
  return static_cast<VW_HANDLE>(all);
}